

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zesOverclockGetDomainProperties
          (zes_overclock_handle_t hDomainHandle,zes_overclock_properties_t *pDomainProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010ead0 != (code *)0x0) {
    zVar1 = (*DAT_0010ead0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetDomainProperties(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_properties_t* pDomainProperties   ///< [in,out] The overclock properties for the specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDomainProperties = context.zesDdiTable.Overclock.pfnGetDomainProperties;
        if( nullptr != pfnGetDomainProperties )
        {
            result = pfnGetDomainProperties( hDomainHandle, pDomainProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }